

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::rule::
replace_top<pstore::exchange::import_ns::compilation,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>,std::reference_wrapper<pstore::uint128_const>>
          (rule *this,transaction<std::unique_lock<mock_mutex>_> *args,string_mapping *args_1,
          reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
          args_2,reference_wrapper<const_pstore::uint128> args_3)

{
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  *this_00;
  error_code eVar1;
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  local_68;
  context *local_60;
  context *context;
  unique_ptr<pstore::exchange::import_ns::compilation,_std::default_delete<pstore::exchange::import_ns::compilation>_>
  local_48;
  __single_object p;
  string_mapping *args_local_1;
  transaction<std::unique_lock<mock_mutex>_> *args_local;
  rule *this_local;
  reference_wrapper<const_pstore::uint128> args_local_3;
  reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  args_local_2;
  error_category *local_10;
  
  p._M_t.
  super___uniq_ptr_impl<pstore::exchange::import_ns::compilation,_std::default_delete<pstore::exchange::import_ns::compilation>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::exchange::import_ns::compilation_*,_std::default_delete<pstore::exchange::import_ns::compilation>_>
  .super__Head_base<0UL,_pstore::exchange::import_ns::compilation_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::exchange::import_ns::compilation,_std::default_delete<pstore::exchange::import_ns::compilation>,_true,_true>
        )(__uniq_ptr_data<pstore::exchange::import_ns::compilation,_std::default_delete<pstore::exchange::import_ns::compilation>,_true,_true>
          )args_1;
  args_local_1 = (string_mapping *)args;
  args_local = (transaction<std::unique_lock<mock_mutex>_> *)this;
  this_local = (rule *)args_3._M_data;
  args_local_3._M_data = (uint128 *)args_2._M_data;
  std::
  make_unique<pstore::exchange::import_ns::compilation,pstore::gsl::not_null<pstore::exchange::import_ns::context*>const&,pstore::transaction<std::unique_lock<mock_mutex>>*&,pstore::exchange::import_ns::string_mapping*&,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>&,std::reference_wrapper<pstore::uint128_const>&>
            ((not_null<pstore::exchange::import_ns::context_*> *)&local_48,
             (transaction<std::unique_lock<mock_mutex>_> **)&this->context_,&args_local_1,
             (reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
              *)&p,&args_local_3);
  log_top(this,false);
  local_60 = get_context(this);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::pop(&local_60->stack);
  this_00 = &local_60->stack;
  std::
  unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
  ::
  unique_ptr<pstore::exchange::import_ns::compilation,std::default_delete<pstore::exchange::import_ns::compilation>,void>
            ((unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>
              *)&local_68,&local_48);
  std::
  stack<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::deque<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>_>
  ::push(this_00,(value_type *)&local_68);
  std::
  unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
  ::~unique_ptr(&local_68);
  log_top(this,true);
  std::error_code::error_code((error_code *)&args_local_2);
  std::
  unique_ptr<pstore::exchange::import_ns::compilation,_std::default_delete<pstore::exchange::import_ns::compilation>_>
  ::~unique_ptr(&local_48);
  eVar1._4_4_ = 0;
  eVar1._M_value = (uint)args_local_2._M_data;
  eVar1._M_cat = local_10;
  return eVar1;
}

Assistant:

std::error_code replace_top (Args... args) {
                    auto p = std::make_unique<T> (context_, args...);
                    this->log_top (false);
                    // Remember the context pointer before we destroy 'this'.
                    auto * const context = this->get_context ();
                    context->stack.pop (); // Destroys this object.
                    context->stack.push (std::move (p));
                    this->log_top (true);
                    return {};
                }